

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int make_table(archive_read *a,huffman_code *code)

{
  int iVar1;
  huffman_table_entry *phVar2;
  huffman_code *code_local;
  archive_read *a_local;
  
  if ((code->maxlength < code->minlength) || (10 < code->maxlength)) {
    code->tablesize = 10;
  }
  else {
    code->tablesize = code->maxlength;
  }
  phVar2 = (huffman_table_entry *)calloc(1,(1L << ((byte)code->tablesize & 0x3f)) << 3);
  code->table = phVar2;
  iVar1 = make_table_recurse(a,code,0,code->table,0,code->tablesize);
  return iVar1;
}

Assistant:

static int
make_table(struct archive_read *a, struct huffman_code *code)
{
  if (code->maxlength < code->minlength || code->maxlength > 10)
    code->tablesize = 10;
  else
    code->tablesize = code->maxlength;

  code->table =
    (struct huffman_table_entry *)calloc(1, sizeof(*code->table)
    * ((size_t)1 << code->tablesize));

  return make_table_recurse(a, code, 0, code->table, 0, code->tablesize);
}